

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

void CanonicalizePath(char *path,size_t *len,uint64_t *slash_bits)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  byte local_231;
  char *end;
  char *src;
  char *dst;
  char *start;
  int component_count;
  char *components [60];
  int kMaxPathComponents;
  uint64_t *slash_bits_local;
  size_t *len_local;
  char *path_local;
  
  if (*len != 0) {
    components[0x3b]._4_4_ = 0x3c;
    start._4_4_ = 0;
    pcVar2 = path + *len;
    bVar1 = IsPathSeparator(*path);
    end = path;
    src = path;
    if (bVar1) {
      end = path + 1;
      src = end;
    }
LAB_002253be:
    if (end < pcVar2) {
      if (*end == '.') {
        if ((end + 1 == pcVar2) || (bVar1 = IsPathSeparator(end[1]), bVar1)) {
          end = end + 2;
          goto LAB_002253be;
        }
        if ((end[1] == '.') && ((end + 2 == pcVar2 || (bVar1 = IsPathSeparator(end[2]), bVar1)))) {
          if (start._4_4_ < 1) {
            *src = *end;
            pcVar3 = src + 2;
            src[1] = end[1];
            src = src + 3;
            *pcVar3 = end[2];
          }
          else {
            src = *(char **)(&stack0xfffffffffffffdf8 + (long)(start._4_4_ + -1) * 8);
            start._4_4_ = start._4_4_ + -1;
          }
          end = end + 3;
          goto LAB_002253be;
        }
      }
      bVar1 = IsPathSeparator(*end);
      if (bVar1) {
        end = end + 1;
      }
      else {
        if (start._4_4_ == 0x3c) {
          Fatal("path has too many components : %s",path);
        }
        *(char **)(&stack0xfffffffffffffdf8 + (long)start._4_4_ * 8) = src;
        start._4_4_ = start._4_4_ + 1;
        while( true ) {
          local_231 = 0;
          if (end != pcVar2) {
            bVar1 = IsPathSeparator(*end);
            local_231 = bVar1 ^ 0xff;
          }
          if ((local_231 & 1) == 0) break;
          *src = *end;
          end = end + 1;
          src = src + 1;
        }
        *src = *end;
        end = end + 1;
        src = src + 1;
      }
      goto LAB_002253be;
    }
    if (src == path) {
      pcVar2 = src + 1;
      *src = '.';
      src = src + 2;
      *pcVar2 = '\0';
    }
    *len = (size_t)(src + (-1 - (long)path));
    *slash_bits = 0;
  }
  return;
}

Assistant:

void CanonicalizePath(char* path, size_t* len, uint64_t* slash_bits) {
  // WARNING: this function is performance-critical; please benchmark
  // any changes you make to it.
  if (*len == 0) {
    return;
  }

  const int kMaxPathComponents = 60;
  char* components[kMaxPathComponents];
  int component_count = 0;

  char* start = path;
  char* dst = start;
  const char* src = start;
  const char* end = start + *len;

  if (IsPathSeparator(*src)) {
#ifdef _WIN32

    // network path starts with //
    if (*len > 1 && IsPathSeparator(*(src + 1))) {
      src += 2;
      dst += 2;
    } else {
      ++src;
      ++dst;
    }
#else
    ++src;
    ++dst;
#endif
  }

  while (src < end) {
    if (*src == '.') {
      if (src + 1 == end || IsPathSeparator(src[1])) {
        // '.' component; eliminate.
        src += 2;
        continue;
      } else if (src[1] == '.' && (src + 2 == end || IsPathSeparator(src[2]))) {
        // '..' component.  Back up if possible.
        if (component_count > 0) {
          dst = components[component_count - 1];
          src += 3;
          --component_count;
        } else {
          *dst++ = *src++;
          *dst++ = *src++;
          *dst++ = *src++;
        }
        continue;
      }
    }

    if (IsPathSeparator(*src)) {
      src++;
      continue;
    }

    if (component_count == kMaxPathComponents)
      Fatal("path has too many components : %s", path);
    components[component_count] = dst;
    ++component_count;

    while (src != end && !IsPathSeparator(*src))
      *dst++ = *src++;
    *dst++ = *src++;  // Copy '/' or final \0 character as well.
  }

  if (dst == start) {
    *dst++ = '.';
    *dst++ = '\0';
  }

  *len = dst - start - 1;
#ifdef _WIN32
  uint64_t bits = 0;
  uint64_t bits_mask = 1;

  for (char* c = start; c < start + *len; ++c) {
    switch (*c) {
      case '\\':
        bits |= bits_mask;
        *c = '/';
        NINJA_FALLTHROUGH;
      case '/':
        bits_mask <<= 1;
    }
  }

  *slash_bits = bits;
#else
  *slash_bits = 0;
#endif
}